

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O1

int curlTimerCallback(CURLM *multi,long timeout_ms,void *userp)

{
  timeval tVar1;
  
  if (timeout_ms == -1) {
    *(undefined8 *)userp = 0xffffffffffffffff;
  }
  else {
    tVar1 = tutil_tvnow();
    *(__time_t *)userp = tVar1.tv_sec;
    *(long *)((long)userp + 8) = timeout_ms * 1000 + tVar1.tv_usec;
  }
  return 0;
}

Assistant:

static int curlTimerCallback(CURLM *multi, long timeout_ms, void *userp)
{
  struct timeval* timeout = userp;

  (void)multi; /* unused */
  if(timeout_ms != -1) {
    *timeout = tutil_tvnow();
    timeout->tv_usec += timeout_ms * 1000;
  }
  else {
    timeout->tv_sec = -1;
  }
  return 0;
}